

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::emsg::print(emsg *this)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined1 local_60 [8];
  sc35_splice_info l_splice;
  emsg *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"=================emsg==================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," e-msg box version: ");
  pvVar3 = (void *)std::ostream::operator<<
                             (poVar2,(uint)(byte)(this->super_full_box).super_box.field_0x62);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout," scheme_id_uri:     ");
  poVar2 = std::operator<<(poVar2,(string *)&this->scheme_id_uri_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," value:             ");
  poVar2 = std::operator<<(poVar2,(string *)&this->value_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," timescale:         ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,this->timescale_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  if ((this->super_full_box).super_box.field_0x62 == '\x01') {
    _Var1 = std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2," presentation_time: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->presentation_time_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    _Var1 = std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2," presentation_time_delta: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->presentation_time_delta_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," event duration:    ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,this->event_duration_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  l_splice._44_4_ = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)l_splice._44_4_);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," event id           ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,this->id_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  l_splice.splice_insert_event_id_ = (uint32_t)std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)l_splice.splice_insert_event_id_);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," message data size  ");
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,sVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->message_data_,0);
  if (*pvVar5 == 0xfc) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->message_data_,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    sc35_splice_info::parse((sc35_splice_info *)local_60,pvVar5,(uint)sVar4);
    poVar2 = std::operator<<((ostream *)&std::cout,"=============splice info==============");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sc35_splice_info::print((sc35_splice_info *)local_60,false);
  }
  return;
}

Assistant:

void emsg::print() const
	{
		std::cout << "=================emsg==================" << std::endl;
		std::cout << std::setw(33) << std::left << " e-msg box version: " << (unsigned int)version_ << std::endl;
		std::cout << " scheme_id_uri:     " << scheme_id_uri_ << std::endl;
		std::cout << std::setw(33) << std::left << " value:             " << value_ << std::endl;
		std::cout << std::setw(33) << std::left << " timescale:         " << timescale_ << std::endl;
		if (version_ == 1)
			std::cout << std::setw(33) << std::left << " presentation_time: " << presentation_time_ << std::endl;
		else
			std::cout << std::setw(33) << std::left << " presentation_time_delta: " << presentation_time_delta_ << std::endl;
		std::cout << std::setw(33) << std::left << " event duration:    " << event_duration_ << std::endl;
		std::cout << std::setw(33) << std::left << " event id           " << id_ << std::endl;
		std::cout << std::setw(33) << std::left << " message data size  " << message_data_.size() << std::endl;

		//print_payload

		if (message_data_[0] == 0xFC)
		{
			// splice table
			//cout << " scte splice info" << endl;
			sc35_splice_info l_splice;
			l_splice.parse((uint8_t*)&message_data_[0], (unsigned int)message_data_.size());
			std::cout << "=============splice info==============" << std::endl;
			l_splice.print();
		}
	}